

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

int __thiscall QLocalSocket::close(QLocalSocket *this,int __fd)

{
  QLocalSocketPrivate *this_00;
  int extraout_EAX;
  
  this_00 = *(QLocalSocketPrivate **)&this->field_0x8;
  QIODevice::close();
  QAbstractSocket::close((QAbstractSocket *)&this_00->unixSocket,__fd);
  QLocalSocketPrivate::cancelDelayedConnect(this_00);
  if (this_00->connectingSocket != -1) {
    ::close(this_00->connectingSocket);
  }
  this_00->connectingSocket = -1;
  QString::clear(&this_00->connectingName);
  (this_00->connectingOpenMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = 0;
  QString::clear(&this_00->serverName);
  QString::clear(&this_00->fullServerName);
  return extraout_EAX;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }